

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test_content.h
# Opt level: O0

void __thiscall data::form_test::form_test(form_test *this)

{
  long lVar1;
  undefined8 *in_RDI;
  master *in_stack_ffffffffffffff90;
  allocator local_61;
  string local_60 [39];
  allocator local_39;
  string local_38 [56];
  
  master::master(in_stack_ffffffffffffff90);
  *in_RDI = &PTR__form_test_00137c70;
  cppcms::form::form((form *)(in_RDI + 0x1e));
  cppcms::widgets::text::text((text *)(in_RDI + 0x24));
  cppcms::widgets::text::text((text *)(in_RDI + 0x75));
  cppcms::form::add((base_widget *)(in_RDI + 0x1e));
  cppcms::form::add((base_widget *)(in_RDI + 0x1e));
  lVar1 = *(long *)(in_RDI[0x24] + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"msg",&local_39);
  cppcms::widgets::base_widget::message((long)in_RDI + lVar1 + 0x120,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  lVar1 = *(long *)(in_RDI[0x24] + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"help",&local_61);
  cppcms::widgets::base_widget::help((long)in_RDI + lVar1 + 0x120,local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

form_test()
		{
			f.add(t1);
			f.add(t2);
			t1.message("msg");
			t1.help("help");
		}